

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::base::PeriodicTask::~PeriodicTask(PeriodicTask *this)

{
  Reset(this);
  WeakPtrFactory<perfetto::base::PeriodicTask>::~WeakPtrFactory(&this->weak_ptr_factory_);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&this->timer_fd_);
  ::std::_Function_base::~_Function_base((_Function_base *)&(this->args_).task);
  return;
}

Assistant:

PeriodicTask::~PeriodicTask() {
  Reset();
}